

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O0

ftmgr * alloc_ftmgr(char *name,chmgr *chmgr,uint32_t *mode)

{
  int iVar1;
  ftmgr *__ptr;
  uint8_t *puVar2;
  int local_c4;
  int i;
  ftmgr *ftmgr;
  stat statbuf;
  uint32_t *mode_local;
  chmgr *chmgr_local;
  char *name_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)mode;
  __ptr = (ftmgr *)malloc(0x100);
  iVar1 = stat(name,(stat *)&ftmgr);
  if (-1 < iVar1) {
    *(undefined4 *)statbuf.__glibc_reserved[2] = (undefined4)statbuf.st_nlink;
    progress_init(&__ptr->pr,statbuf.st_rdev,chmgr);
    iVar1 = open(name,0);
    __ptr->fd = iVar1;
    if (-1 < __ptr->fd) {
      __ptr->offset = 0;
      __ptr->chmgr = chmgr;
      __ptr->tts = '\0';
      __ptr->bitmap = 0xff;
      for (local_c4 = 0; local_c4 < 8; local_c4 = local_c4 + 1) {
        puVar2 = (uint8_t *)malloc(0x1fb);
        __ptr->ftq[local_c4].blk = puVar2;
      }
      return __ptr;
    }
  }
  free(__ptr);
  return (ftmgr *)0x0;
}

Assistant:

struct ftmgr *alloc_ftmgr(const char *name, struct chmgr *chmgr, uint32_t *mode)
{
    struct stat statbuf;
    struct ftmgr *ftmgr = (struct ftmgr*)malloc(sizeof(struct ftmgr));
    if(stat(name, &statbuf) < 0)
        goto _err;
    *mode = statbuf.st_mode;
    progress_init(&ftmgr->pr, statbuf.st_size, chmgr);

    ftmgr->fd = open(name, O_RDONLY);
    if(ftmgr->fd < 0)
        goto _err;

    ftmgr->offset = 0;
    ftmgr->chmgr = chmgr;
    ftmgr->tts = 0;
    ftmgr->bitmap = (__typeof__(ftmgr->bitmap))-1;
    for(int i = 0;i < FTQ_NR;i++) {
        ftmgr->ftq[i].blk = malloc(BLK_MTU);
    }
    return ftmgr;
_err:
    free(ftmgr);
    return NULL;
}